

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBox::coarsen(TagBox *this,IntVect *ratio,Box *cbox)

{
  bool bVar1;
  char *__dest;
  Elixir *this_00;
  size_t __n;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int ii;
  int ioff;
  int jj;
  int joff;
  int kk;
  int koff;
  TagType t;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Dim3 r;
  Box fdomain;
  Array4<char> *carr;
  Elixir eli;
  TagBox cfab;
  Array4<const_char> *farr;
  Arena *in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  int n;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  TagBox *in_stack_fffffffffffffb30;
  Box *this_01;
  BaseFab<char> *pBVar2;
  IntVect local_49c;
  int local_490;
  int local_48c;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  char local_475;
  int local_474;
  int local_470;
  int local_46c;
  undefined8 local_468;
  int local_460;
  undefined8 local_454;
  int local_44c;
  int local_448;
  int iStack_444;
  int local_440;
  int local_438;
  int iStack_434;
  int local_430;
  undefined8 local_428;
  int local_420;
  Box local_418;
  undefined1 local_3f8 [96];
  Box local_398 [2];
  undefined1 local_350 [72];
  int *local_308;
  undefined8 *local_300;
  Box *local_2e8;
  undefined4 local_2dc;
  undefined8 *local_2d8;
  undefined4 local_2cc;
  undefined8 *local_2c8;
  undefined4 local_2bc;
  undefined8 *local_2b8;
  int local_2b0;
  int iStack_2ac;
  int local_2a8;
  int *local_2a0;
  int local_298;
  int iStack_294;
  int local_290;
  undefined4 local_28c;
  int *local_288;
  undefined4 local_27c;
  int *local_278;
  undefined4 local_26c;
  int *local_268;
  undefined8 local_260;
  int local_258;
  int *local_250;
  int local_248;
  int iStack_244;
  int local_240;
  undefined4 local_23c;
  int *local_238;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  int *local_218;
  int local_20c;
  int local_208;
  int local_204;
  BaseFab<char> *local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  BaseFab<char> *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  char *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  uint local_b4;
  IndexType *local_b0;
  char *local_a8;
  Dim3 local_a0;
  IndexType *local_90;
  uint local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  IndexType *local_78;
  undefined4 local_6c;
  IndexType *local_68;
  undefined4 local_5c;
  IndexType *local_58;
  Dim3 local_50;
  IndexType *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  n = (int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  local_198 = *(char **)(in_RDI + 0x10);
  local_1a0 = (undefined8 *)(in_RDI + 0x18);
  local_1a4 = *(int *)(in_RDI + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(in_RDI + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(in_RDI + 0x20);
  local_f8 = (int *)(in_RDI + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = in_RDI + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(in_RDI + 0x28) + 1;
  local_118 = in_RDI + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(in_RDI + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  pBVar2 = (BaseFab<char> *)local_350;
  local_308 = in_RDX;
  local_300 = in_RSI;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<const_char>::Array4((Array4<const_char> *)pBVar2,local_198,&local_1b0,&local_1d0,local_1a4)
  ;
  local_350._64_8_ = pBVar2;
  The_Arena();
  TagBox(in_stack_fffffffffffffb30,
         (Box *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),n,
         in_stack_fffffffffffffb18);
  this_01 = local_398;
  BaseFab<char>::elixir<char,_0>(pBVar2);
  local_a8 = *(char **)((this_01->bigend).vect + 1);
  local_b0 = &this_01->btype;
  local_b4 = this_01[1].btype.itype;
  local_5c = 0;
  local_88 = local_b0->itype;
  local_6c = 1;
  iStack_84 = this_01[1].smallend.vect[0];
  local_d0._0_8_ = *(undefined8 *)local_b0;
  local_7c = 2;
  local_d0.z = this_01[1].smallend.vect[1];
  local_8 = this_01[1].smallend.vect + 2;
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = this_01[1].smallend.vect + 2;
  local_1c = 1;
  iStack_34 = this_01[1].bigend.vect[0] + 1;
  local_28 = this_01[1].smallend.vect + 2;
  local_2c = 2;
  local_f0.z = this_01[1].bigend.vect[1] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  pBVar2 = (BaseFab<char> *)local_3f8;
  local_2e8 = this_01;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<char>::Array4((Array4<char> *)pBVar2,local_a8,&local_c0,&local_e0,local_b4);
  local_418.smallend.vect._0_8_ = *(undefined8 *)(in_RDI + 0x18);
  local_418._20_8_ = *(undefined8 *)(in_RDI + 0x2c);
  local_418.bigend.vect[1] = (int)((ulong)*(undefined8 *)(in_RDI + 0x24) >> 0x20);
  local_418.smallend.vect[2] = (int)*(undefined8 *)(in_RDI + 0x20);
  local_418.bigend.vect[0] = (int)((ulong)*(undefined8 *)(in_RDI + 0x20) >> 0x20);
  local_2b8 = local_300;
  local_2bc = 0;
  local_2c8 = local_300;
  local_2cc = 1;
  local_428 = *local_300;
  local_2d8 = local_300;
  local_2dc = 2;
  local_420 = *(int *)(local_300 + 1);
  local_2a0 = local_308;
  local_268 = local_308;
  local_26c = 0;
  local_298 = *local_308;
  local_278 = local_308;
  local_27c = 1;
  iStack_294 = local_308[1];
  local_288 = local_308;
  local_28c = 2;
  local_46c = local_308[2];
  local_250 = local_308;
  local_218 = local_308 + 3;
  local_21c = 0;
  local_248 = *local_218;
  local_228 = local_308 + 3;
  local_22c = 1;
  iStack_244 = local_308[4];
  local_468 = *(undefined8 *)local_218;
  local_238 = local_308 + 3;
  local_23c = 2;
  local_460 = local_308[5];
  local_454 = local_468;
  local_44c = local_460;
  local_440 = local_46c;
  local_430 = local_46c;
  local_3f8._64_8_ = pBVar2;
  local_2a8 = local_46c;
  local_290 = local_46c;
  local_260 = local_468;
  local_258 = local_460;
  local_240 = local_460;
  local_438 = local_298;
  iStack_434 = iStack_294;
  local_448 = local_298;
  iStack_444 = iStack_294;
  local_2b0 = local_298;
  iStack_2ac = iStack_294;
  for (; local_46c <= local_44c; local_46c = local_46c + 1) {
    for (local_470 = iStack_434; local_470 <= local_454._4_4_; local_470 = local_470 + 1) {
      for (local_474 = local_438; local_474 <= (int)local_454; local_474 = local_474 + 1) {
        local_475 = '\0';
        for (local_47c = 0; local_47c < local_420; local_47c = local_47c + 1) {
          local_480 = local_46c * local_420 + local_47c;
          for (local_484 = 0; local_484 < local_428._4_4_; local_484 = local_484 + 1) {
            local_488 = local_470 * local_428._4_4_ + local_484;
            for (local_48c = 0; local_48c < (int)local_428; local_48c = local_48c + 1) {
              local_490 = local_474 * (int)local_428 + local_48c;
              IntVect::IntVect(&local_49c,local_490,local_488,local_480);
              bVar1 = Box::contains(&local_418,&local_49c);
              if ((bVar1) && (bVar1 = local_475 == '\0', local_475 = '\x01', bVar1)) {
                local_200 = (BaseFab<char> *)local_350._64_8_;
                local_204 = local_490;
                local_208 = local_488;
                local_20c = local_480;
                local_475 = *(char *)((long)*(_func_int ***)local_350._64_8_ +
                                     (long)(local_490 -
                                           ((Dim3 *)((long)(((Box *)(local_350._64_8_ + 0x18))->
                                                           smallend).vect + 8))->x) +
                                     (long)(local_488 -
                                           (((Box *)(local_350._64_8_ + 0x18))->bigend).vect[0]) *
                                     (long)((DataAllocator *)(local_350._64_8_ + 8))->m_arena +
                                     (long)(local_480 -
                                           (((Box *)(local_350._64_8_ + 0x18))->bigend).vect[1]) *
                                     (long)*(char **)(local_350._64_8_ + 0x10)) != '\0';
              }
            }
          }
        }
        local_1e8 = (BaseFab<char> *)local_3f8._64_8_;
        local_1ec = local_474;
        local_1f0 = local_470;
        local_1f4 = local_46c;
        *(char *)((long)*(_func_int ***)local_3f8._64_8_ +
                 (long)(local_474 -
                       ((Dim3 *)((long)(((Box *)(local_3f8._64_8_ + 0x18))->smallend).vect + 8))->x)
                 + (long)(local_470 - (((Box *)(local_3f8._64_8_ + 0x18))->bigend).vect[0]) *
                   (long)((DataAllocator *)(local_3f8._64_8_ + 8))->m_arena +
                 (long)(local_46c - (((Box *)(local_3f8._64_8_ + 0x18))->bigend).vect[1]) *
                 (long)*(char **)(local_3f8._64_8_ + 0x10)) = local_475;
      }
    }
  }
  __dest = BaseFab<char>::dataPtr(pBVar2,(int)((ulong)this_01 >> 0x20));
  this_00 = (Elixir *)BaseFab<char>::dataPtr(pBVar2,(int)((ulong)this_01 >> 0x20));
  __n = Box::numPts(this_01);
  memcpy(__dest,this_00,__n);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)local_308;
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(local_308 + 2);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(local_308 + 4);
  *(int *)(in_RDI + 0x30) = local_308[6];
  Gpu::Elixir::~Elixir(this_00);
  ~TagBox((TagBox *)0x135e3bd);
  return;
}

Assistant:

void
TagBox::coarsen (const IntVect& ratio, const Box& cbox) noexcept
{
    BL_ASSERT(nComp() == 1);
    Array4<char const> const& farr = this->const_array();

    TagBox cfab(cbox, 1, The_Arena());
    Elixir eli = cfab.elixir();
    Array4<char> const& carr = cfab.array();

    Box fdomain = domain;
    Dim3 r{1,1,1};
    AMREX_D_TERM(r.x = ratio[0];, r.y = ratio[1];, r.z = ratio[2]);

    AMREX_HOST_DEVICE_FOR_3D(cbox, i, j, k,
    {
        TagType t = TagBox::CLEAR;
        for (int koff = 0; koff < r.z; ++koff) {
            int kk = k*r.z + koff;
            for (int joff = 0; joff < r.y; ++joff) {
                int jj = j*r.y + joff;
                for (int ioff = 0; ioff < r.x; ++ioff) {
                    int ii = i*r.x + ioff;
                    if (fdomain.contains(IntVect(AMREX_D_DECL(ii,jj,kk)))) {
                        t = t || farr(ii,jj,kk);
                    }
                }
            }
        }
        carr(i,j,k) = t;
    });

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        Gpu::dtod_memcpy_async(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    } else
#endif
    {
        std::memcpy(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    }
    this->domain = cbox;
}